

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlEscapeFormatString(xmlChar **msg)

{
  xmlChar *pxVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((msg != (xmlChar **)0x0) && (pxVar3 = *msg, pxVar3 != (xmlChar *)0x0)) {
    xVar2 = *pxVar3;
    if (xVar2 == '\0') {
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      uVar4 = 0;
      do {
        uVar7 = uVar4 + 1;
        uVar6 = uVar6 + (xVar2 == '%');
        xVar2 = pxVar3[uVar4 + 1];
        uVar4 = uVar7;
      } while (xVar2 != '\0');
    }
    if (uVar6 == 0) {
      return pxVar3;
    }
    if (uVar7 <= 0x7fffffff - uVar6 && uVar6 < 0x80000000) {
      pxVar3 = (xmlChar *)(*xmlMalloc)(uVar7 + uVar6 + 1);
      if (pxVar3 == (xmlChar *)0x0) {
        pxVar3 = (xmlChar *)0x0;
      }
      else {
        xVar2 = **msg;
        pxVar1 = *msg;
        pxVar5 = pxVar3;
        while (xVar2 != '\0') {
          *pxVar5 = xVar2;
          if (*pxVar1 == '%') {
            pxVar5[1] = '%';
            pxVar5 = pxVar5 + 1;
          }
          pxVar5 = pxVar5 + 1;
          xVar2 = pxVar1[1];
          pxVar1 = pxVar1 + 1;
        }
        pxVar3[uVar7 + uVar6] = '\0';
      }
      (*xmlFree)(*msg);
      *msg = pxVar3;
      return pxVar3;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEscapeFormatString(xmlChar **msg)
{
    xmlChar *msgPtr = NULL;
    xmlChar *result = NULL;
    xmlChar *resultPtr = NULL;
    size_t count = 0;
    size_t msgLen = 0;
    size_t resultLen = 0;

    if (!msg || !*msg)
        return(NULL);

    for (msgPtr = *msg; *msgPtr != '\0'; ++msgPtr) {
        ++msgLen;
        if (*msgPtr == '%')
            ++count;
    }

    if (count == 0)
        return(*msg);

    if ((count > INT_MAX) || (msgLen > INT_MAX - count))
        return(NULL);
    resultLen = msgLen + count + 1;
    result = xmlMalloc(resultLen);
    if (result == NULL) {
        /* Clear *msg to prevent format string vulnerabilities in
           out-of-memory situations. */
        xmlFree(*msg);
        *msg = NULL;
        return(NULL);
    }

    for (msgPtr = *msg, resultPtr = result; *msgPtr != '\0'; ++msgPtr, ++resultPtr) {
        *resultPtr = *msgPtr;
        if (*msgPtr == '%')
            *(++resultPtr) = '%';
    }
    result[resultLen - 1] = '\0';

    xmlFree(*msg);
    *msg = result;

    return *msg;
}